

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraCodeBlocksGenerator::GetDocumentation
          (cmExtraCodeBlocksGenerator *this,cmDocumentationEntry *entry,string *param_2)

{
  string local_40 [32];
  string *local_20;
  string *param_2_local;
  cmDocumentationEntry *entry_local;
  cmExtraCodeBlocksGenerator *this_local;
  
  local_20 = param_2;
  param_2_local = &entry->Name;
  entry_local = (cmDocumentationEntry *)this;
  (*(this->super_cmExternalMakefileProjectGenerator)._vptr_cmExternalMakefileProjectGenerator[2])
            (local_40);
  std::__cxx11::string::operator=((string *)param_2_local,local_40);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::operator=
            ((string *)(param_2_local + 1),"Generates CodeBlocks project files.");
  return;
}

Assistant:

void cmExtraCodeBlocksGenerator
::GetDocumentation(cmDocumentationEntry& entry, const std::string&) const
{
  entry.Name = this->GetName();
  entry.Brief = "Generates CodeBlocks project files.";
}